

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# glsFboUtil.cpp
# Opt level: O0

bool __thiscall
deqp::gls::FboUtil::FormatDB::ExtensionInfo::operator<(ExtensionInfo *this,ExtensionInfo *other)

{
  bool bVar1;
  bool local_29;
  bool local_19;
  ExtensionInfo *other_local;
  ExtensionInfo *this_local;
  
  bVar1 = std::operator<(&this->requiredExtensions,&other->requiredExtensions);
  local_19 = true;
  if (!bVar1) {
    bVar1 = std::operator==(&this->requiredExtensions,&other->requiredExtensions);
    local_29 = false;
    if (bVar1) {
      local_29 = (int)this->flags < (int)other->flags;
    }
    local_19 = local_29;
  }
  return local_19;
}

Assistant:

bool FormatDB::ExtensionInfo::operator< (const ExtensionInfo& other) const
{
	return (requiredExtensions < other.requiredExtensions) ||
		   ((requiredExtensions == other.requiredExtensions) && (flags < other.flags));
}